

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_String * cff_index_get_name(CFF_Font_conflict font,FT_UInt element)

{
  FT_Stream pFVar1;
  FT_Memory memory;
  FT_String *__dest;
  FT_Error error;
  FT_Byte *bytes;
  FT_ULong byte_len;
  int local_3c;
  FT_Byte *local_38;
  size_t local_30;
  
  pFVar1 = (font->name_index).stream;
  if (pFVar1 != (FT_Stream)0x0) {
    memory = pFVar1->memory;
    local_3c = cff_index_access_element(&font->name_index,element,&local_38,&local_30);
    if (local_3c == 0) {
      __dest = (FT_String *)ft_mem_alloc(memory,local_30 + 1,&local_3c);
      if (local_3c == 0) {
        if (local_30 != 0) {
          memcpy(__dest,local_38,local_30);
        }
        __dest[local_30] = '\0';
      }
      if ((font->name_index).bytes != (FT_Byte *)0x0) {
        return __dest;
      }
      FT_Stream_ReleaseFrame((font->name_index).stream,&local_38);
      return __dest;
    }
  }
  return (FT_String *)0x0;
}

Assistant:

FT_LOCAL_DEF( FT_String* )
  cff_index_get_name( CFF_Font  font,
                      FT_UInt   element )
  {
    CFF_Index   idx = &font->name_index;
    FT_Memory   memory;
    FT_Byte*    bytes;
    FT_ULong    byte_len;
    FT_Error    error;
    FT_String*  name = 0;


    if ( !idx->stream )  /* CFF2 does not include a name index */
      goto Exit;

    memory = idx->stream->memory;

    error = cff_index_access_element( idx, element, &bytes, &byte_len );
    if ( error )
      goto Exit;

    if ( !FT_ALLOC( name, byte_len + 1 ) )
    {
      if ( byte_len )
        FT_MEM_COPY( name, bytes, byte_len );
      name[byte_len] = 0;
    }
    cff_index_forget_element( idx, &bytes );

  Exit:
    return name;
  }